

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::DropDirectoryItem(cmComputeLinkInformation *this,string *item)

{
  ostream *poVar1;
  string *psVar2;
  ostringstream e;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"WARNING: Target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\" requests linking to directory \"");
  poVar1 = std::operator<<(poVar1,(string *)item);
  poVar1 = std::operator<<(poVar1,"\".  ");
  poVar1 = std::operator<<(poVar1,"Targets may link only to libraries.  ");
  std::operator<<(poVar1,"CMake is dropping the item.");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(&local_1b0,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(std::string const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  std::ostringstream e;
  e << "WARNING: Target \"" << this->Target->GetName()
    << "\" requests linking to directory \"" << item << "\".  "
    << "Targets may link only to libraries.  "
    << "CMake is dropping the item.";
  cmSystemTools::Message(e.str());
}